

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DLightFlash::DLightFlash(DLightFlash *this,sector_t *sector,int min,int max)

{
  short sVar1;
  uint uVar2;
  int max_local;
  int min_local;
  sector_t *sector_local;
  DLightFlash *this_local;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b6d160;
  sVar1 = sector_t::ClampLight(max);
  this->m_MaxLight = (int)sVar1;
  sVar1 = sector_t::ClampLight(min);
  this->m_MinLight = (int)sVar1;
  this->m_MaxTime = 0x40;
  this->m_MinTime = 7;
  uVar2 = FRandom::operator()(&pr_lightflash);
  this->m_Count = (uVar2 & this->m_MaxTime) + 1;
  return;
}

Assistant:

DLightFlash::DLightFlash (sector_t *sector, int min, int max)
	: DLighting (sector)
{
	// Use specified light levels.
	m_MaxLight = sector_t::ClampLight(max);
	m_MinLight = sector_t::ClampLight(min);
	m_MaxTime = 64;
	m_MinTime = 7;
	m_Count = (pr_lightflash() & m_MaxTime) + 1;
}